

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O1

object * primitive(int primitiveNumber,object *args,int *failed)

{
  uchar *to;
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  __int32_t **pp_Var5;
  void *pvVar6;
  uintptr_t uVar7;
  uint *puVar8;
  FILE *pFVar9;
  object *poVar10;
  object *poVar11;
  size_t sVar12;
  object **ppoVar13;
  ssize_t sVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  in_addr iVar18;
  FILE **ppFVar19;
  char *pcVar20;
  int iVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  long lVar34;
  int iVar35;
  ushort uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  char acStack_80 [8];
  undefined1 local_78 [8];
  sockaddr_in sin;
  char netBuffer [18];
  in_addr local_48;
  uint local_44;
  in_addr iaddr;
  undefined4 uStack_3c;
  
  poVar11 = nilObject;
  *failed = 0;
  if (0x95 < primitiveNumber) {
    switch(primitiveNumber) {
    case 0x96:
      poVar10 = (object *)args[1].header;
      uVar17 = poVar10->header;
      if ((uVar17 & 2) == 0) {
        pcVar20 = "#position: failed, first arg is not a binary object.";
      }
      else {
        uVar38 = (args[1].class)->header;
        if ((uVar38 & 2) != 0) {
          uVar37 = (uint)uVar17;
          if (uVar37 < 4) {
            return poVar11;
          }
          uVar3 = (uint)uVar38;
          if (uVar3 < 4) {
            return poVar11;
          }
          uVar37 = uVar37 >> 2;
          uVar3 = uVar3 >> 2;
          if (uVar37 < uVar3) {
            return poVar11;
          }
          pcVar22 = local_78 + -(ulong)(uVar37 + 0x10 & 0xfffffff0);
          pcVar20 = pcVar22 + -(ulong)(uVar3 + 0x10 & 0xfffffff0);
          pcVar20[-8] = '\x1f';
          pcVar20[-7] = -0x4d;
          pcVar20[-6] = '\x10';
          pcVar20[-5] = '\0';
          pcVar20[-4] = '\0';
          pcVar20[-3] = '\0';
          pcVar20[-2] = '\0';
          pcVar20[-1] = '\0';
          getUnixString(pcVar22,uVar37 + 1,poVar10);
          poVar11 = args[1].class;
          pcVar20[-8] = '.';
          pcVar20[-7] = -0x4d;
          pcVar20[-6] = '\x10';
          pcVar20[-5] = '\0';
          pcVar20[-4] = '\0';
          pcVar20[-3] = '\0';
          pcVar20[-2] = '\0';
          pcVar20[-1] = '\0';
          getUnixString(pcVar20,uVar3 + 1,poVar11);
          pcVar20[-8] = '9';
          pcVar20[-7] = -0x4d;
          pcVar20[-6] = '\x10';
          pcVar20[-5] = '\0';
          pcVar20[-4] = '\0';
          pcVar20[-3] = '\0';
          pcVar20[-2] = '\0';
          pcVar20[-1] = '\0';
          pcVar20 = strstr(pcVar22,pcVar20);
          if (pcVar20 == (char *)0x0) {
            return nilObject;
          }
          return (object *)(((long)pcVar20 - (long)pcVar22) * 2 + 3);
        }
        pcVar20 = "#position: failed, second arg is not a binary object.";
      }
      acStack_80[0] = 'r';
      acStack_80[1] = -0x4f;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      puts(pcVar20);
      goto LAB_0010b172;
    case 0x97:
      poVar11 = (object *)args[1].header;
      local_44 = (uint)poVar11->header;
      iVar18.s_addr = local_44 >> 2;
      iVar4 = 0;
      _iaddr = (object *)CONCAT44(uStack_3c,iVar18.s_addr);
      if (3 < local_44) {
        uVar17 = 0;
        iVar4 = 0;
        do {
          acStack_80[0] = -0x71;
          acStack_80[1] = -0x57;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pvVar6 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",
                          (int)*(char *)((long)&poVar11[1].header + uVar17),0x1b);
          iVar4 = (iVar4 + 1) - (uint)(pvVar6 == (void *)0x0);
          uVar17 = uVar17 + 1;
        } while (iVar18.s_addr + (iVar18.s_addr == 0) != uVar17);
        iVar4 = iVar4 * 2;
        iVar18.s_addr = iaddr.s_addr;
      }
      lVar16 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar16] = poVar11;
      iVar4 = iVar4 + iVar18.s_addr;
      builtin_strncpy(acStack_80,"ҩ\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar11 = gcialloc(iVar4);
      poVar11->class = StringClass;
      lVar16 = (long)rootTop;
      rootTop = rootTop + -1;
      if (poVar11 == (object *)0x0) {
        acStack_80[0] = -0x7a;
        acStack_80[1] = -0x4e;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        error_impl("stringToUrl",0x2d4,"stringToUrl(): unable to allocate string!");
        poVar11 = nilObject;
      }
      else if ((3 < local_44) && (iVar4 != 0)) {
        poVar10 = (&oldTop)[lVar16];
        _iaddr = (object *)((ulong)_iaddr & 0xffffffff);
        iVar21 = 0;
        lVar16 = 0x10;
        do {
          cVar2 = *(char *)((long)&poVar10->header + lVar16);
          acStack_80[0] = '7';
          acStack_80[1] = -0x56;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          pvVar6 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",(int)cVar2,0x1b);
          if (pvVar6 == (void *)0x0) {
            if (cVar2 == ' ') {
              cVar2 = '+';
            }
            lVar34 = (long)iVar21;
            iVar21 = iVar21 + 1;
            *(char *)((long)&poVar11[1].header + lVar34) = cVar2;
          }
          else {
            lVar34 = (long)iVar21;
            *(undefined1 *)((long)&poVar11[1].header + lVar34) = 0x25;
            *(char *)((long)&poVar11[1].header + lVar34 + 1) =
                 "0123456789ABCDEF"[*(byte *)((long)&poVar10->header + lVar16) >> 4];
            iVar21 = iVar21 + 3;
            *(char *)((long)&poVar11[1].header + lVar34 + 2) =
                 "0123456789ABCDEF"[*(byte *)((long)&poVar10->header + lVar16) & 0xf];
          }
        } while ((lVar16 - 0xfU < _iaddr) && (lVar16 = lVar16 + 1, iVar21 < iVar4));
      }
      break;
    case 0x98:
      poVar11 = (object *)args[1].header;
      uVar37 = (uint)poVar11->header;
      uVar3 = uVar37 >> 2;
      iVar4 = 0;
      if (3 < uVar37) {
        uVar17 = 0;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (uint)(*(char *)((long)&poVar11[1].header + uVar17) == '%');
          uVar17 = uVar17 + 1;
        } while (uVar3 + (uVar3 == 0) != uVar17);
        iVar4 = iVar4 * 2;
      }
      lVar16 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar16] = poVar11;
      iVar4 = uVar3 - iVar4;
      iVar21 = 0;
      if (0 < iVar4) {
        iVar21 = iVar4;
      }
      acStack_80[0] = 'D';
      acStack_80[1] = -0x55;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar11 = gcialloc(iVar21);
      poVar11->class = StringClass;
      lVar16 = (long)rootTop;
      rootTop = rootTop + -1;
      if (poVar11 != (object *)0x0) {
        if (uVar37 < 4) {
          return poVar11;
        }
        if (iVar4 < 1) {
          return poVar11;
        }
        poVar10 = (&oldTop)[lVar16];
        uVar17 = (ulong)uVar3;
        iVar35 = 0;
        lVar16 = 0x10;
        iVar4 = 0;
        _iaddr = (object *)uVar17;
        do {
          cVar2 = *(char *)((long)&poVar10->header + lVar16);
          if (cVar2 == '+') {
            cVar2 = ' ';
          }
          if (cVar2 == '%') {
            iVar4 = 3;
          }
          if (iVar4 == 1) {
            acStack_80[0] = '\x15';
            acStack_80[1] = -0x54;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            pp_Var5 = __ctype_toupper_loc();
            acStack_80[0] = '3';
            acStack_80[1] = -0x54;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            pvVar6 = memchr("0123456789ABCDEF",(*pp_Var5)[cVar2],0x11);
            iVar4 = (int)pvVar6 + -0x10e361;
            if (iVar4 < 0) goto LAB_0010b2a9;
            pcVar20 = (char *)((long)&poVar11[1].header + (long)iVar35);
            *pcVar20 = *pcVar20 + (char)iVar4;
            iVar35 = iVar35 + 1;
            iVar4 = 0;
            uVar17 = (ulong)_iaddr;
          }
          else if (iVar4 == 3) {
            iVar4 = 2;
          }
          else if (iVar4 == 2) {
            builtin_strncpy(acStack_80,"Ϋ\x10",4);
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            pp_Var5 = __ctype_toupper_loc();
            acStack_80[0] = -0x14;
            acStack_80[1] = -0x55;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            pvVar6 = memchr("0123456789ABCDEF",(*pp_Var5)[cVar2],0x11);
            iVar4 = (int)pvVar6 + -0x10e361;
            if (iVar4 < 0) goto LAB_0010b2a9;
            *(char *)((long)&poVar11[1].header + (long)iVar35) = (char)iVar4 << 4;
            iVar4 = 1;
            uVar17 = (ulong)_iaddr;
          }
          else {
            lVar34 = (long)iVar35;
            iVar35 = iVar35 + 1;
            *(char *)((long)&poVar11[1].header + lVar34) = cVar2;
          }
          if (uVar17 <= lVar16 - 0xfU) {
            return poVar11;
          }
          lVar16 = lVar16 + 1;
          if (iVar21 <= iVar35) {
            return poVar11;
          }
        } while( true );
      }
      acStack_80[0] = -0x57;
      acStack_80[1] = -0x4e;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      error_impl("urlToString",0x324,"urlToString(): unable to allocate string!");
LAB_0010b2a9:
      ppoVar13 = &nilObject;
      goto LAB_0010b52a;
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
switchD_0010a76c_default:
      pcVar20 = "unknown primitive %d!";
      iVar4 = 0x247;
LAB_0010a93e:
      acStack_80[0] = 'E';
      acStack_80[1] = -0x57;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      error_impl("primitive",iVar4,pcVar20);
      break;
    case 0xa0:
      builtin_strncpy(acStack_80,"ɪ\x10",4);
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      printf("Log: %.*s\n",(ulong)(*(uint *)args[1].header >> 2),(uint *)args[1].header + 4);
      *failed = 0;
      poVar11 = nilObject;
      break;
    case 0xa1:
      acStack_80[0] = -0x70;
      acStack_80[1] = -0x54;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      uVar7 = time_usec();
      acStack_80[0] = -99;
      acStack_80[1] = -0x54;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      poVar11 = gcialloc(8);
      poVar11->class = IntegerClass;
      poVar11[1].header = uVar7;
      *failed = 0;
      break;
    default:
      if (primitiveNumber == 0xaa) {
        poVar11 = (object *)((long)&memoryPointer->header + (long)(prog_argc * -8 + -0x10));
        memoryPointer = poVar11;
        if ((long)poVar11 < (long)memoryBase) {
          acStack_80[0] = 'U';
          acStack_80[1] = -0x4f;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          poVar11 = gcollect(prog_argc);
        }
        else {
          poVar11->header = (ulong)(uint)(prog_argc << 2);
        }
        poVar11->class = ArrayClass;
        lVar16 = (long)rootTop;
        rootTop = rootTop + 1;
        rootStack[lVar16] = poVar11;
        if (0 < prog_argc) {
          lVar16 = 0;
          do {
            pcVar20 = prog_argv[lVar16];
            acStack_80[0] = -0x1c;
            acStack_80[1] = -0x4f;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            sVar12 = strlen(pcVar20);
            uVar37 = (uint)sVar12;
            acStack_80[0] = -0x11;
            acStack_80[1] = -0x4f;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            poVar11 = gcialloc(uVar37);
            poVar11->class = StringClass;
            if (0 < (int)uVar37) {
              uVar17 = 0;
              do {
                *(char *)((long)&poVar11[1].header + uVar17) = pcVar20[uVar17];
                uVar17 = uVar17 + 1;
              } while ((uVar37 & 0x7fffffff) != uVar17);
            }
            (&(&oldTop)[rootTop][1].header)[lVar16] = (uintptr_t)poVar11;
            lVar16 = lVar16 + 1;
          } while (lVar16 < prog_argc);
        }
        lVar16 = (long)rootTop;
        rootTop = rootTop + -1;
        poVar11 = (&oldTop)[lVar16];
        *failed = 0;
        return poVar11;
      }
      if (primitiveNumber != 200) goto switchD_0010a76c_default;
      switch(args[1].header >> 1 & 0xffffffff) {
      case 0:
        acStack_80[0] = -0x5d;
        acStack_80[1] = -0x58;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        uVar37 = socket(2,1,0);
        if (uVar37 == 0xffffffff) {
          builtin_strncpy(acStack_80,"Ĩ\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x1be,"Cannot open TCP socket.");
        }
        sin.sin_zero[0] = '\x01';
        sin.sin_zero[1] = '\0';
        sin.sin_zero[2] = '\0';
        sin.sin_zero[3] = '\0';
        acStack_80[0] = -0x1b;
        acStack_80[1] = -0x58;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        iVar4 = setsockopt(uVar37,1,2,sin.sin_zero,4);
        if (iVar4 != 0) {
          acStack_80[0] = -0x10;
          acStack_80[1] = -0x58;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          close(uVar37);
          acStack_80[0] = '\n';
          acStack_80[1] = -0x57;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x1c5,"Error setting socket reuse option!");
        }
        acStack_80[0] = '&';
        acStack_80[1] = -0x57;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        info_impl("primitive",0x1ca,"opened socket %d.",(ulong)uVar37);
        break;
      case 1:
        iVar21 = (int)((ulong)args[1].class >> 1);
        builtin_strncpy(acStack_80,"ճ\x10",4);
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        iVar4 = listen(iVar21,10);
        if (iVar4 == -1) {
          acStack_80[0] = -0xc;
          acStack_80[1] = -0x4d;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x1d4,"Error listening on TCP socket.");
        }
        local_78._0_4_ = 0x10;
        acStack_80[0] = '\t';
        acStack_80[1] = -0x4c;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        uVar37 = accept(iVar21,(sockaddr *)sin.sin_zero,(socklen_t *)local_78);
        if (uVar37 == 0xffffffff) {
          acStack_80[0] = '\x15';
          acStack_80[1] = -0x4c;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          puVar8 = (uint *)__errno_location();
          acStack_80[0] = '1';
          acStack_80[1] = -0x4c;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x1de,"Error accepting on TCP socket.  Errno=%d",(ulong)*puVar8);
        }
        break;
      case 2:
        uVar17 = (ulong)args[1].class >> 1;
        acStack_80[0] = 'n';
        acStack_80[1] = -0x4d;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        info_impl("primitive",0x1e8,"closing socket %d.",uVar17 & 0xffffffff);
        acStack_80[0] = 'u';
        acStack_80[1] = -0x4d;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        close((int)uVar17);
        goto LAB_0010b523;
      case 3:
        uVar17 = (ulong)args[1].class >> 1;
        to = sin.sin_zero;
        acStack_80[0] = ']';
        acStack_80[1] = -0x4c;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        getUnixString((char *)to,0x11,(object *)args[2].header);
        uVar38 = (ulong)args[2].class >> 1;
        acStack_80[0] = -0x7d;
        acStack_80[1] = -0x4c;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        info_impl("primitive",0x1f8,"Socket: %d",uVar17 & 0xffffffff);
        acStack_80[0] = -100;
        acStack_80[1] = -0x4c;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        info_impl("primitive",0x1f9,"IP: %s",to);
        acStack_80[0] = -0x4b;
        acStack_80[1] = -0x4c;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        info_impl("primitive",0x1fa,"Port: %d",uVar38 & 0xffffffff);
        builtin_strncpy(acStack_80,"t\x10",4);
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        iVar4 = inet_aton((char *)to,&local_48);
        if (iVar4 == 0) {
          builtin_strncpy(acStack_80,"ߴ\x10",4);
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x1fe,"Illegal address passed to bind primitive.");
        }
        uVar36 = (ushort)uVar38;
        local_78._2_2_ = uVar36 << 8 | uVar36 >> 8;
        local_78._0_2_ = 2;
        local_78._4_4_ = local_48.s_addr;
        acStack_80[0] = '\x04';
        acStack_80[1] = -0x4b;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        iVar4 = bind((int)uVar17,(sockaddr *)local_78,0x10);
        if (iVar4 == -1) {
          acStack_80[0] = '#';
          acStack_80[1] = -0x4b;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          error_impl("primitive",0x208,"Cannot bind TCP socket to address.");
        }
LAB_0010b523:
        ppoVar13 = &trueObject;
LAB_0010b52a:
        return *ppoVar13;
      default:
        pcVar20 = "Unknown socket primitive operation: %d!";
        iVar4 = 0x240;
        goto LAB_0010a93e;
      case 7:
        poVar10 = args[1].class;
        acStack_80[0] = 'L';
        acStack_80[1] = -0x4b;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        memset(socketReadBuffer,0,0x400);
        acStack_80[0] = '_';
        acStack_80[1] = -0x4b;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        uVar17 = read((int)((ulong)poVar10 >> 1),socketReadBuffer,0x400);
        uVar37 = (uint)uVar17;
        if ((int)uVar37 < 0) {
          acStack_80[0] = 'l';
          acStack_80[1] = -0x4b;
          acStack_80[2] = '\x10';
          acStack_80[3] = '\0';
          acStack_80[4] = '\0';
          acStack_80[5] = '\0';
          acStack_80[6] = '\0';
          acStack_80[7] = '\0';
          piVar15 = __errno_location();
          if (*piVar15 != 0xb) {
            acStack_80[0] = -0x1d;
            acStack_80[1] = -0x4b;
            acStack_80[2] = '\x10';
            acStack_80[3] = '\0';
            acStack_80[4] = '\0';
            acStack_80[5] = '\0';
            acStack_80[6] = '\0';
            acStack_80[7] = '\0';
            info_impl("primitive",0x218,"socket read returned an error: %d (%d)!",
                      uVar17 & 0xffffffff);
            goto LAB_0010b172;
          }
        }
        acStack_80[0] = '}';
        acStack_80[1] = -0x4b;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        poVar11 = gcialloc(uVar37);
        poVar11->class = ByteArrayClass;
        if ((int)uVar37 < 1) {
          return poVar11;
        }
        uVar17 = 0;
        do {
          *(uint8_t *)((long)&poVar11[1].header + uVar17) = socketReadBuffer[uVar17];
          uVar17 = uVar17 + 1;
        } while ((uVar37 & 0x7fffffff) != uVar17);
        return poVar11;
      case 8:
        acStack_80[0] = -0x6d;
        acStack_80[1] = -0x4d;
        acStack_80[2] = '\x10';
        acStack_80[3] = '\0';
        acStack_80[4] = '\0';
        acStack_80[5] = '\0';
        acStack_80[6] = '\0';
        acStack_80[7] = '\0';
        sVar14 = write((int)((ulong)args[1].class >> 1),(uint *)args[2].header + 4,
                       (ulong)(*(uint *)args[2].header >> 2));
        if ((int)sVar14 < 1) {
          return nilObject;
        }
        return (object *)((ulong)(uint)((int)sVar14 * 2) + 1);
      }
LAB_0010b434:
      poVar11 = (object *)((long)(int)uVar37 * 2 + 1);
    }
    return poVar11;
  }
  switch(primitiveNumber) {
  case 100:
    poVar10 = (object *)args[1].header;
    uVar37 = (uint)poVar10->header >> 2;
    lVar16 = -(ulong)(uVar37 + 0x10 & 0xfffffff0);
    pcVar20 = local_78 + lVar16;
    uVar3 = (uint)(args[1].class)->header >> 2;
    lVar34 = -(ulong)(uVar3 + 0x10 & 0xfffffff0);
    pcVar22 = pcVar20 + lVar34;
    pcVar22[-8] = -0x51;
    pcVar22[-7] = -0x59;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    getUnixString(pcVar20,uVar37 + 1,poVar10);
    poVar10 = args[1].class;
    pcVar22[-8] = -0x42;
    pcVar22[-7] = -0x59;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    getUnixString(pcVar22,uVar3 + 1,poVar10);
    builtin_strncpy(local_78 + lVar34 + lVar16 + -8,"ɧ\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    pFVar9 = fopen(pcVar20,pcVar22);
    if (pFVar9 != (FILE *)0x0) {
      ppFVar19 = filePointers;
      uVar17 = 0;
      do {
        if (*ppFVar19 == (FILE *)0x0) goto LAB_0010a7f6;
        uVar17 = uVar17 + 1;
        ppFVar19 = ppFVar19 + 1;
      } while (uVar17 != 200);
      uVar17 = 200;
LAB_0010a7f6:
      if (199 < (uint)uVar17) {
        pcVar22[-8] = '\x1c';
        pcVar22[-7] = -0x58;
        pcVar22[-6] = '\x10';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        error_impl("primitive",0x61,"too many open files");
        return poVar11;
      }
      filePointers[uVar17 & 0xffffffff] = (FILE *)pFVar9;
      return (object *)((uVar17 & 0xffffffff) * 2 + 1);
    }
    break;
  case 0x65:
    uVar17 = args[1].header >> 1;
    if ((199 < (uint)uVar17) || ((FILE *)filePointers[uVar17 & 0xff] == (FILE *)0x0)) break;
    acStack_80[0] = -0x12;
    acStack_80[1] = -0x53;
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    uVar37 = fgetc((FILE *)filePointers[uVar17 & 0xff]);
    if (uVar37 == 0xffffffff) {
      return poVar11;
    }
    goto LAB_0010b434;
  case 0x66:
    uVar17 = args[1].header >> 1;
    if (((uint)uVar17 < 200) && ((FILE *)filePointers[uVar17 & 0xff] != (FILE *)0x0)) {
      acStack_80[0] = '%';
      acStack_80[1] = -0x53;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fputc((int)((ulong)args[1].class >> 1),(FILE *)filePointers[uVar17 & 0xff]);
      return poVar11;
    }
    break;
  case 0x67:
    uVar17 = args[1].header >> 1;
    if (((uint)uVar17 < 200) && ((FILE *)filePointers[uVar17 & 0xff] != (FILE *)0x0)) {
      acStack_80[0] = 'X';
      acStack_80[1] = -0x53;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fclose((FILE *)filePointers[uVar17 & 0xff]);
      return poVar11;
    }
    break;
  case 0x68:
    uVar17 = args[1].header >> 1;
    if (((uint)uVar17 < 200) && (filePointers[uVar17 & 0xff] != (FILE *)0x0)) {
      acStack_80[0] = -0x15;
      acStack_80[1] = -0x54;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      fileOut(filePointers[uVar17 & 0xff]);
      return poVar11;
    }
    break;
  case 0x69:
    acStack_80[0] = '\x17';
    acStack_80[1] = -0x52;
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    iVar4 = snprintf((char *)0x0,0,"%s/lsteditXXXXXX",tmpdir);
    lVar34 = (long)iVar4;
    acStack_80[0] = '<';
    acStack_80[1] = -0x52;
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    info_impl("primitive",0x9d,"temporary file name size is %d",(ulong)(iVar4 + 1));
    lVar16 = -(lVar34 + 0x11U & 0xfffffffffffffff0);
    pcVar20 = local_78 + lVar16;
    pcVar23 = acStack_80 + lVar16;
    pcVar23[0] = '`';
    pcVar23[1] = -0x52;
    pcVar23[2] = '\x10';
    pcVar23[3] = '\0';
    pcVar23[4] = '\0';
    pcVar23[5] = '\0';
    pcVar23[6] = '\0';
    pcVar23[7] = '\0';
    memset(pcVar20,0,lVar34 + 2U);
    pcVar24 = acStack_80 + lVar16;
    pcVar24[0] = '{';
    pcVar24[1] = -0x52;
    pcVar24[2] = '\x10';
    pcVar24[3] = '\0';
    pcVar24[4] = '\0';
    pcVar24[5] = '\0';
    pcVar24[6] = '\0';
    pcVar24[7] = '\0';
    snprintf(pcVar20,lVar34 + 2U,"%s/lsteditXXXXXX",tmpdir);
    pcVar25 = acStack_80 + lVar16;
    pcVar25[0] = -0x6c;
    pcVar25[1] = -0x52;
    pcVar25[2] = '\x10';
    pcVar25[3] = '\0';
    pcVar25[4] = '\0';
    pcVar25[5] = '\0';
    pcVar25[6] = '\0';
    pcVar25[7] = '\0';
    info_impl("primitive",0xa4,"DEBUG: temp file name pattern: %s",pcVar20);
    pcVar26 = acStack_80 + lVar16;
    pcVar26[0] = -100;
    pcVar26[1] = -0x52;
    pcVar26[2] = '\x10';
    pcVar26[3] = '\0';
    pcVar26[4] = '\0';
    pcVar26[5] = '\0';
    pcVar26[6] = '\0';
    pcVar26[7] = '\0';
    iVar4 = mkstemp(pcVar20);
    if (iVar4 == -1) {
      pcVar27 = acStack_80 + lVar16;
      pcVar27[0] = -0x5a;
      pcVar27[1] = -0x52;
      pcVar27[2] = '\x10';
      pcVar27[3] = '\0';
      pcVar27[4] = '\0';
      pcVar27[5] = '\0';
      pcVar27[6] = '\0';
      pcVar27[7] = '\0';
      puVar8 = (uint *)__errno_location();
      uVar37 = *puVar8;
      pcVar28 = acStack_80 + lVar16;
      builtin_strncpy(acStack_80 + lVar16,"®\x10",4);
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      error_impl("primitive",0xa9,"error making temporary file name: errno=%d!",(ulong)uVar37);
    }
    pcVar29 = acStack_80 + lVar16;
    builtin_strncpy(acStack_80 + lVar16,"Ѯ\x10",4);
    pcVar29[4] = '\0';
    pcVar29[5] = '\0';
    pcVar29[6] = '\0';
    pcVar29[7] = '\0';
    pFVar9 = fopen(pcVar20,"w");
    if (pFVar9 == (FILE *)0x0) {
      pcVar30 = acStack_80 + lVar16;
      pcVar30[0] = -10;
      pcVar30[1] = -0x52;
      pcVar30[2] = '\x10';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      error_impl("primitive",0xae,"cannot open temp edit file %s!",pcVar20);
    }
    puVar8 = (uint *)args[1].header;
    uVar37 = *puVar8;
    _iaddr = args;
    if (3 < uVar37) {
      uVar37 = uVar37 >> 2;
      lVar39 = 0;
      do {
        bVar1 = *(byte *)((long)puVar8 + lVar39 + 0x10);
        pcVar31 = acStack_80 + lVar16;
        pcVar31[0] = ')';
        pcVar31[1] = -0x51;
        pcVar31[2] = '\x10';
        pcVar31[3] = '\0';
        pcVar31[4] = '\0';
        pcVar31[5] = '\0';
        pcVar31[6] = '\0';
        pcVar31[7] = '\0';
        fputc((uint)bVar1,pFVar9);
        lVar39 = lVar39 + 1;
      } while (uVar37 + (uVar37 == 0) != (int)lVar39);
    }
    pcVar32 = acStack_80 + lVar16;
    pcVar32[0] = '>';
    pcVar32[1] = -0x51;
    pcVar32[2] = '\x10';
    pcVar32[3] = '\0';
    pcVar32[4] = '\0';
    pcVar32[5] = '\0';
    pcVar32[6] = '\0';
    pcVar32[7] = '\0';
    fputc(10,pFVar9);
    pcVar33 = acStack_80 + lVar16;
    pcVar33[0] = 'F';
    pcVar33[1] = -0x51;
    pcVar33[2] = '\x10';
    pcVar33[3] = '\0';
    pcVar33[4] = '\0';
    pcVar33[5] = '\0';
    pcVar33[6] = '\0';
    pcVar33[7] = '\0';
    fclose(pFVar9);
    uVar17 = lVar34 + 0x14U & 0xfffffffffffffff0;
    lVar39 = -uVar17;
    pcVar22 = pcVar20 + lVar39;
    pcVar22[-8] = 'l';
    pcVar22[-7] = -0x51;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    memset(pcVar22,0,lVar34 + 5);
    builtin_strncpy(local_78 + (lVar16 - uVar17),"vi ",4);
    pcVar22[-8] = -0x7d;
    pcVar22[-7] = -0x51;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    strcat(pcVar22,pcVar20);
    pcVar22[-8] = -0x75;
    pcVar22[-7] = -0x51;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    iVar4 = system(pcVar22);
    if (iVar4 == -1) {
      pcVar22[-8] = -0x6b;
      pcVar22[-7] = -0x51;
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      puVar8 = (uint *)__errno_location();
      uVar37 = *puVar8;
      pcVar22[-8] = -0x4f;
      pcVar22[-7] = -0x51;
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      error_impl("primitive",0xc5,"error starting editor: %d!",(ulong)uVar37);
    }
    builtin_strncpy(local_78 + lVar39 + lVar16 + -8,"/\x10",4);
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    pFVar9 = fopen(pcVar20,"r");
    poVar11 = _iaddr;
    if (pFVar9 == (FILE *)0x0) {
      pcVar22[-8] = -0x17;
      pcVar22[-7] = -0x51;
      pcVar22[-6] = '\x10';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      error_impl("primitive",0xcb,"cannot open temp edit file %s!",pcVar20);
    }
    pcVar22[-8] = -8;
    pcVar22[-7] = -0x51;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fseek(pFVar9,0,2);
    pcVar22[-8] = '\0';
    pcVar22[-7] = -0x50;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    lVar16 = ftell(pFVar9);
    uVar37 = (uint)lVar16;
    pcVar22[-8] = '\v';
    pcVar22[-7] = -0x50;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    poVar10 = gcialloc(uVar37);
    poVar10->class = *(object **)(poVar11[1].header + 8);
    pcVar22[-8] = '&';
    pcVar22[-7] = -0x50;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fseek(pFVar9,0,0);
    if (0 < (int)uVar37) {
      uVar17 = 0;
      do {
        pcVar22[-8] = '<';
        pcVar22[-7] = -0x50;
        pcVar22[-6] = '\x10';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        iVar4 = fgetc(pFVar9);
        *(char *)((long)&poVar10[1].header + uVar17) = (char)iVar4;
        uVar17 = uVar17 + 1;
      } while ((uVar37 & 0x7fffffff) != uVar17);
    }
    pcVar22[-8] = 'Q';
    pcVar22[-7] = -0x50;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    fclose(pFVar9);
    pcVar22[-8] = 'Z';
    pcVar22[-7] = -0x50;
    pcVar22[-6] = '\x10';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    unlink(pcVar20);
    return poVar10;
  case 0x6a:
    uVar17 = args[1].header >> 1;
    if ((199 < (uint)uVar17) || ((FILE *)filePointers[uVar17 & 0xff] == (FILE *)0x0)) break;
    poVar11 = args[1].class;
    if (((poVar11->header & 2) == 0) ||
       (uVar37 = (uint)(args[2].header >> 1), ((uint)(poVar11->header >> 2) & 0x3fffffff) < uVar37))
    break;
    acStack_80[0] = -0x43;
    acStack_80[1] = -0x50;
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    sVar12 = fread(poVar11 + 1,1,(ulong)(uVar37 & 0x7fffffff),(FILE *)filePointers[uVar17 & 0xff]);
    iVar4 = (int)sVar12;
    goto LAB_0010b0bd;
  case 0x6b:
    uVar17 = args[1].header >> 1;
    if ((199 < (uint)uVar17) || ((FILE *)filePointers[uVar17 & 0xff] == (FILE *)0x0)) break;
    poVar11 = args[1].class;
    if (((poVar11->header & 2) == 0) ||
       (uVar37 = (uint)(args[2].header >> 1), ((uint)(poVar11->header >> 2) & 0x3fffffff) < uVar37))
    break;
    acStack_80[0] = -0x45;
    acStack_80[1] = -0x53;
    acStack_80[2] = '\x10';
    acStack_80[3] = '\0';
    acStack_80[4] = '\0';
    acStack_80[5] = '\0';
    acStack_80[6] = '\0';
    acStack_80[7] = '\0';
    sVar12 = fwrite(poVar11 + 1,1,(ulong)(uVar37 & 0x7fffffff),(FILE *)filePointers[uVar17 & 0xff]);
    iVar4 = (int)sVar12;
LAB_0010b0bd:
    if (-1 < iVar4) {
      return (object *)((ulong)(uint)(iVar4 * 2) + 1);
    }
    break;
  case 0x6c:
    uVar17 = args[1].header >> 1;
    if ((((uint)uVar17 < 200) && ((FILE *)filePointers[uVar17 & 0xff] != (FILE *)0x0)) &&
       (((ulong)args[1].class >> 0x20 & 1) == 0)) {
      acStack_80[0] = '\v';
      acStack_80[1] = -0x4f;
      acStack_80[2] = '\x10';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      iVar4 = fseek((FILE *)filePointers[uVar17 & 0xff],(ulong)args[1].class >> 1 & 0x7fffffff,0);
      if (-1 < iVar4) {
        return (object *)(ulong)(iVar4 * 2 + 1);
      }
    }
    break;
  default:
    goto switchD_0010a76c_default;
  }
LAB_0010b172:
  *failed = 1;
  return poVar11;
}

Assistant:

struct object *primitive(int primitiveNumber, struct object *args, int *failed)
{
    struct object *returnedValue = nilObject;
    int i, j;
    int rc;
    FILE *fp;
    uint8_t *p;
    struct byteObject *stringReturn;
    //char nameBuffer[80], modeBuffer[80];
    int subPrim=0;
    char netBuffer[18];
    struct sockaddr myAddr;
    struct sockaddr_in sin;
    struct in_addr iaddr;
    socklen_t myAddrSize;
    int sock;
    int sock_opt;
    int port;
    struct byteObject *ba;


    *failed = 0;
    switch(primitiveNumber) {
    case 100:
    {
        /* open a file */
        int pathSize = SIZE(args->data[0]) + 1;
        char *pathBuffer = (char *)alloca((size_t)pathSize);
        int modeSize = SIZE(args->data[1]) + 1;
        char *modeBuffer = (char *)alloca((size_t)modeSize);

        getUnixString(pathBuffer, pathSize, args->data[0]);
        getUnixString(modeBuffer, modeSize, args->data[1]);

        fp = fopen(pathBuffer, modeBuffer);
        if (fp != NULL) {
            for (i = 0; i < FILEMAX; ++i) {
                if (filePointers[i] == NULL) {
                    break;
                }
            }
            if (i >= FILEMAX) {
                error("too many open files");
            } else {
                returnedValue = newInteger(i);
                filePointers[i] = fp;
            }
        } else {
            *failed = 1;
        }
    }

    break;

    case 101:	/* read a single character from a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        i = fgetc(fp);
        if (i != EOF) {
            returnedValue = newInteger(i);
        }
        break;

    case 102:	/* write a single character to a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fputc(integerValue(args->data[1]), fp);
        break;

    case 103:	/* close file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fclose(fp);
        break;

    case 104:	/* file out image */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fileOut(fp);
        break;

    case 105:
    {
        /* edit a string */
        char *tmpFileName = NULL;
        size_t tmpFileNameSize = 0;

        /* first get the size needed for the temporary path */
        tmpFileNameSize = (size_t)snprintf(tmpFileName, 0, "%s/lsteditXXXXXX", tmpdir) + 1;

        info("temporary file name size is %d", (int)tmpFileNameSize);

        /* allocate it on the stack and write the string into it. */
        tmpFileName = (char *)alloca((size_t)tmpFileNameSize + 1);
        memset(tmpFileName, 0, tmpFileNameSize + 1);
        snprintf(tmpFileName, tmpFileNameSize + 1, "%s/lsteditXXXXXX", tmpdir);

        info("DEBUG: temp file name pattern: %s",tmpFileName);

        rc = mkstemp(tmpFileName);
        /* copy string to file */
        if(rc == -1) {
            error("error making temporary file name: errno=%d!", errno);
        }

        fp = fopen(tmpFileName, "w");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        j = SIZE(args->data[0]);
        p = ((struct byteObject *) args->data[0])->bytes;

        for (i = 0; i < j; i++) {
            fputc(*p++, fp);
        }
        fputc('\n', fp);

        fclose(fp);

        /* call the editor */
        size_t cmdBufSize = tmpFileNameSize + strlen("vi ");
        char *cmdBuf = (char*)alloca(cmdBufSize + 1);
        memset(cmdBuf, 0, cmdBufSize + 1);

        strcpy(cmdBuf,"vi ");
        strcat(cmdBuf, tmpFileName);
        rc = system(cmdBuf);

        if(rc == -1) {
            error("error starting editor: %d!",(int)errno);
        }

        /* copy back to new string */
        fp = fopen(tmpFileName, "r");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        /* get length of file */
        fseek(fp, 0, 2);
        j = (int) ftell(fp);

        returnedValue = (struct object *)(stringReturn = (struct byteObject *)gcialloc(j));
        returnedValue->class = args->data[0]->class;

        /* reset to beginning, and read values */
        fseek(fp, 0, 0);

        /* FIXME - check for EOF! */
        for (i = 0; i < j; i++) {
            stringReturn->bytes[i] = (uint8_t)fgetc(fp);
        }
        /* now clean up files */
        fclose(fp);
        unlink(tmpFileName);
    }

    break;

    case 106:	/* Read into ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're populating an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fread(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 107:	/* Write from ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're writing an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fwrite(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 108:	/* Seek to file position */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* File position */
        i = integerValue(args->data[1]);
        if ((i < 0) || ((i = fseek(fp, i, SEEK_SET)) < 0)) {
            *failed = 1;
            break;
        }

        /* Return position as our value */
        returnedValue = newInteger(i);
        break;


    case 150:	/* match substring in a string. Return index of substring or fail. */
        /* make sure we've got strings */
        if(!IS_BINOBJ(args->data[0])) {
            printf("#position: failed, first arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        if(!IS_BINOBJ(args->data[1])) {
            printf("#position: failed, second arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        /* get the sizes of the strings */
        i = SIZE(args->data[0]);
        j = SIZE(args->data[1]);

        /*
         * don't bother to compare if either string has a zero length
         * or the second string is longer than the first
         */

        if((i > 0) && (j > 0) && (i>=j)) {
            /* using alloca to make sure that the memory is freed automatically */
            char *p = (char *)alloca((size_t)i+1);
            char *q = (char *)alloca((size_t)j+1);
            char *r = (char *)0;

            getUnixString(p,i+1,args->data[0]);
            getUnixString(q,j+1,args->data[1]);

            /* find the pointer to the substring */
            r = strstr(p,q);

            if(r != NULL) {
                /* the string was found */
                returnedValue = newInteger((r-p)+1);
            } else {
                returnedValue = nilObject;
            }

            /* success */
            break;
        } else {
            if((i<0) || (j<0)) {
                printf("#position: failed due to unusable string sizes, string 1 size %d, string 2 size %d.\n", i, j);
            } else {
                /* i==0 or j==0 or i<j in which case we have no match but no error. */
                returnedValue = nilObject;
                break;
            }
        }

        /* if we get here, we've failed */
        *failed = 1;
        break;

    case 151: /* convert a string to URL encoding, returns nil or string */
        returnedValue = stringToUrl((struct byteObject *)args->data[0]);

        break;


    case 152: /* convert a string from URL encoding, returns nil or string */
        returnedValue = urlToString((struct byteObject *)args->data[0]);

        break;

    /* large timestamps */
    case 160: /* print out a microsecond timestamp and message string. */
        {
            struct byteObject *msg = (struct byteObject *)(args->data[0]);

            printf("Log: %.*s\n", SIZE(msg), bytePtr(msg));

            *failed = 0;

            returnedValue = nilObject;
        }

        break;

    case 161: /* return an Integer with the microsecond timestamp. */
        returnedValue = newLInteger(time_usec());
        *failed = 0;
        break;

    case 170: /* get argv strings as an Array of Strings. */
        {
            struct object *argv_array = NULL;

            /* allocate enough space for the result Array. */
            argv_array = gcalloc(prog_argc);
            argv_array->class = ArrayClass;

            /* we are going to allocate Strings and that could cause GC. */
            PUSH_ROOT(argv_array);

            for(int index = 0; index < prog_argc; index++) {
                struct object *argv_entry = NULL;
                const char *argv_str = prog_argv[index];
                int str_len = (int)strlen(argv_str);

                /* could cause GC */
                argv_entry = gcialloc(str_len);
                argv_entry->class = StringClass;

                /* copy the bytes. */
                for(int i=0; i < str_len; i++) {
                    bytePtr(argv_entry)[i] = (uint8_t)argv_str[i];
                }

                /* get the pointer to the array again.   Could have changed due to GC. */
                argv_array = PEEK_ROOT();

                argv_array->data[index] = argv_entry;
            }

            argv_array = POP_ROOT();

            returnedValue = argv_array;

            *failed = 0;
        }

        break;

    case 200: /* this is a set of primitives for socket handling */
        subPrim = integerValue(args->data[0]);

        /* 200-250 socket handling */
        switch(subPrim) {
        case 0: /* open a TCP socket */
            sock = socket(PF_INET,SOCK_STREAM,0);

            if(sock == -1) {
                error("Cannot open TCP socket.");
            }

            sock_opt = 1;

            if(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&sock_opt, sizeof(sock_opt))) {
                close(sock);
                error("Error setting socket reuse option!");
            }

            /* return the value anyway */

            info("opened socket %d.", sock);

            returnedValue = newInteger(sock);

            break;

        case 1: /* accept on a socket */
            sock = integerValue(args->data[1]);

            if(listen(sock, 10) == -1) {
                error("Error listening on TCP socket.");
            }

            /* set the maximum size */
            myAddrSize = sizeof(myAddr);

            /* printf("accept(%d, %p, %d)\n", sock, &myAddr, myAddrSize); */

            sock = accept(sock, &myAddr, &myAddrSize);
            if(sock == -1) {
                error("Error accepting on TCP socket.  Errno=%d", errno);
            }

            returnedValue = newInteger(sock);

            break;

        case 2: /* close a socket */
            sock = integerValue(args->data[1]);

            info("closing socket %d.", sock);

            close(sock);

            returnedValue = trueObject;

            break;

        case 3: /* bind a socket to an address and port */
            /* this takes three arguments, the socket fd,
            the address (as a dotted-notation string) and
            the port as an integer */
            sock = integerValue(args->data[1]);
            getUnixString(netBuffer, sizeof(netBuffer)-1, args->data[2]);
            port = integerValue(args->data[3]);

            info("Socket: %d",sock);
            info("IP: %s",netBuffer);
            info("Port: %d",port);

            /* convert the string IP to a network representation */
            if(inet_aton((const char *)netBuffer,&iaddr) == 0) {
                error("Illegal address passed to bind primitive.");
            }

            /* build a sockaddr_in struct */
            sin.sin_family = AF_INET;
            sin.sin_port = htons((u_int16_t)port);
            /*			sin.sin_port = (u_int16_t)0;*/
            sin.sin_addr = iaddr;

            if(bind(sock,(struct sockaddr *)&sin,sizeof(sin)) == -1) {
                error("Cannot bind TCP socket to address.");
            }

            returnedValue = trueObject;

            break;

        case 7: /* read from a TCP socket.  This returns a byte array. */
            sock = integerValue(args->data[1]);

            for(i=0; i<SOCK_BUF_SIZE; i++) {
                socketReadBuffer[i]=(char)0;
            }

            i = (int)read(sock,(void *)socketReadBuffer,(size_t)SOCK_BUF_SIZE);
            if((i < 0) && (errno != EAGAIN) && (errno != EWOULDBLOCK)) {
                info("socket read returned an error: %d (%d)!", i, errno);
                *failed = 1;
                break;
            }

//            printf("Read: %s\n",socketReadBuffer);

            ba = (struct byteObject *)gcialloc(i);
            ba->class = ByteArrayClass;

            /* copy data into the new ByteArray */
            for(j=0; j<i; j++) {
                bytePtr(ba)[j] = socketReadBuffer[j];
            }

            returnedValue = (struct object *)ba;

            break;

        case 8: /* write to a socket, args: sock, data */
            sock = integerValue(args->data[1]);
            p = (uint8_t *)bytePtr(args->data[2]);
            i = SIZE(args->data[2]);

            /*printf("Writing: ");
            snprintf(socketReadBuffer,i,"%s",p);
            socketReadBuffer[i] = (char)0;
            printf("%s\n",socketReadBuffer);
            */

            j = (int)write(sock,(void *)p,(size_t)i);

            if(j>0)
                returnedValue = newInteger(j);
            else
                returnedValue = nilObject;

            break;

        default: /* unknown socket primitive */
            error("Unknown socket primitive operation: %d!",subPrim);
            break;
        }

        break;

    default:
        error("unknown primitive %d!", primitiveNumber);
    }
    return(returnedValue);
}